

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMatcher.h
# Opt level: O0

bool __thiscall OrderMatcher::insert(OrderMatcher *this,Order *order)

{
  bool bVar1;
  string *psVar2;
  pointer ppVar3;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_Market>_>::value,_pair<iterator,_bool>_>
  _Var4;
  Market local_1b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>
  local_108;
  _Base_ptr local_38;
  undefined1 local_30;
  _Self local_28;
  _Self local_20;
  iterator i;
  Order *order_local;
  OrderMatcher *this_local;
  
  i._M_node = (_Base_ptr)order;
  psVar2 = Order::getSymbol_abi_cxx11_(order);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>_>
       ::find(&this->m_markets,psVar2);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>_>
       ::end(&this->m_markets);
  bVar1 = std::operator==(&local_20,&local_28);
  if (bVar1) {
    psVar2 = Order::getSymbol_abi_cxx11_((Order *)i._M_node);
    local_1b8.m_askOrders._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_1b8.m_askOrders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1b8.m_askOrders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1b8.m_askOrders._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_1b8.m_askOrders._M_t._M_impl._0_8_ = 0;
    local_1b8.m_askOrders._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1b8.m_askOrders._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_1b8.m_bidOrders._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_1b8.m_bidOrders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1b8.m_bidOrders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1b8.m_bidOrders._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_1b8.m_bidOrders._M_t._M_impl._0_8_ = 0;
    local_1b8.m_bidOrders._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1b8.m_bidOrders._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_1b8.m_orderUpdates.c.super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
    super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_1b8.m_orderUpdates.c.super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
    super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_1b8.m_orderUpdates.c.super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_1b8.m_orderUpdates.c.super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
    super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_1b8.m_orderUpdates.c.super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
    super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_1b8.m_orderUpdates.c.super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
    super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_1b8.m_orderUpdates.c.super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
    super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_1b8.m_orderUpdates.c.super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
    super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_1b8.m_orderUpdates.c.super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_1b8.m_orderUpdates.c.super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
    super__Deque_impl_data._M_map_size = 0;
    Market::Market(&local_1b8);
    std::make_pair<std::__cxx11::string_const&,Market>(&local_108,psVar2,&local_1b8);
    _Var4 = std::
            map<std::__cxx11::string,Market,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Market>>>
            ::insert<std::pair<std::__cxx11::string,Market>>
                      ((map<std::__cxx11::string,Market,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Market>>>
                        *)this,&local_108);
    local_38 = (_Base_ptr)_Var4.first._M_node;
    local_30 = _Var4.second;
    local_20._M_node = local_38;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>::
    ~pair(&local_108);
    Market::~Market(&local_1b8);
  }
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>
           ::operator->(&local_20);
  bVar1 = Market::insert(&ppVar3->second,(Order *)i._M_node);
  return bVar1;
}

Assistant:

bool insert(const Order &order) {
    Markets::iterator i = m_markets.find(order.getSymbol());
    if (i == m_markets.end()) {
      i = m_markets.insert(std::make_pair(order.getSymbol(), Market())).first;
    }
    return i->second.insert(order);
  }